

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_font * rf_load_image_font_from_data
                    (rf_font *__return_storage_ptr__,rf_image image,rf_glyph_info *glyphs,
                    rf_int glyphs_count)

{
  rf_mipmaps_image image_00;
  rf_image rVar1;
  undefined8 unaff_retaddr;
  
  rVar1 = image;
  __return_storage_ptr__->base_size = 0;
  image_00.field_0._8_8_ = image.data;
  image_00.field_0.image.data = (void *)unaff_retaddr;
  image_00.field_0._16_4_ = image.width;
  image_00.field_0._20_4_ = image.height;
  image_00.mipmaps = image.format;
  image_00._28_1_ = image.valid;
  image_00._29_3_ = image._21_3_;
  rf_load_texture_from_image_with_mipmaps(image_00);
  __return_storage_ptr__->glyphs = glyphs;
  __return_storage_ptr__->glyphs_count = glyphs_count;
  __return_storage_ptr__->valid = false;
  if (((0 < glyphs_count) && (glyphs != (rf_glyph_info *)0x0)) &&
     (image.valid = rVar1.valid, image.valid != false)) {
    __return_storage_ptr__->base_size = (int)(glyphs->field_0).rec.height;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_font rf_load_image_font_from_data(rf_image image, rf_glyph_info* glyphs, rf_int glyphs_count)
{
    rf_font result = {
        .texture      = rf_load_texture_from_image(image),
        .glyphs       = glyphs,
        .glyphs_count = glyphs_count,
    };

    if (image.valid && glyphs && glyphs_count > 0)
    {
        result.base_size = glyphs[0].height;
        result.valid     = true;
    }

    return result;
}